

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O0

int __thiscall Jupiter::HTTP::Server::think(Server *this)

{
  Data *pDVar1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  bool bVar2;
  byte bVar3;
  int iVar4;
  size_type sVar5;
  _If_sv<std::basic_string_view<char>,_size_type> _Var6;
  vector<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
  *this_00;
  reference this_01;
  pointer pSVar7;
  undefined4 extraout_var;
  type pSVar8;
  pointer pHVar9;
  ssize_t sVar10;
  size_type sVar11;
  size_type sVar12;
  type pHVar13;
  Data *in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  __normal_iterator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_*,_std::vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>_>
  *__rhs;
  int in_R8D;
  string_view sVar14;
  bool local_182;
  bool local_181;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  undefined4 local_15c;
  size_t local_158;
  char *local_150;
  size_t local_148;
  char *local_140;
  string_view local_138;
  undefined1 local_128 [8];
  string_view sock_buffer_1;
  __single_object session_1;
  unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_> *port;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
  *__range1;
  unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_> socket;
  const_iterator local_c8;
  unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *local_c0;
  const_iterator local_b8;
  unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *local_b0;
  const_iterator local_a8;
  unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *local_a0;
  rep local_98;
  undefined1 local_90 [8];
  string_view sock_buffer;
  __unspec local_69;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_60;
  type local_52;
  __unspec local_51;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  type local_39;
  const_iterator local_38;
  unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *local_30;
  reference local_28;
  unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *session;
  __normal_iterator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_*,_std::vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>_>
  local_18;
  iterator itr;
  Server *this_local;
  
  itr._M_current = (unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)this;
  local_18._M_current =
       (unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
       std::
       vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
       ::begin(&this->m_data->m_sessions);
LAB_0019bdfb:
  do {
    session = (unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
              std::
              vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
              ::end(&this->m_data->m_sessions);
    __rhs = (__normal_iterator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_*,_std::vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>_>
             *)&session;
    bVar2 = __gnu_cxx::
            operator==<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_*,_std::vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>_>
                      (&local_18,__rhs);
    iVar4 = (int)__rhs;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_28 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_*,_std::vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>_>
               ::operator*(&local_18);
    pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->(local_28);
    bVar2 = Socket::isShutdown(&pHVar9->sock);
    if (!bVar2) {
      local_48.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->(local_28)
      ;
      local_50 = std::chrono::operator+
                           (&pHVar9->last_active,&this->m_data->keep_alive_session_timeout);
      local_39 = (type)std::chrono::
                       operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 (&local_48,&local_50);
      iVar4 = 0;
      std::__cmp_cat::__unspec::__unspec(&local_51,(__unspec *)0x0);
      bVar2 = std::operator>(local_39);
      in_RCX = (Data *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar2);
      local_181 = true;
      if (!bVar2) {
        pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                           (local_28);
        bVar3 = pHVar9->keep_alive & 1;
        in_RCX = (Data *)(ulong)bVar3;
        local_182 = false;
        if (bVar3 == 0) {
          local_60.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
          pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                             (local_28);
          local_68 = std::chrono::operator+(&pHVar9->last_active,&this->m_data->session_timeout);
          local_52 = (type)std::chrono::
                           operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     (&local_60,&local_68);
          iVar4 = 0;
          std::__cmp_cat::__unspec::__unspec(&local_69,(__unspec *)0x0);
          local_182 = std::operator>(local_52);
        }
        local_181 = local_182;
      }
      if (local_181 != false) {
        pDVar1 = this->m_data;
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>const*,std::vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>>
        ::__normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>*>
                  ((__normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>const*,std::vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>>
                    *)&sock_buffer._M_str,&local_18);
        local_18._M_current =
             (unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
             std::
             vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
             ::erase(&pDVar1->m_sessions,(const_iterator)sock_buffer._M_str);
        goto LAB_0019bdfb;
      }
      pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->(local_28)
      ;
      sVar10 = Socket::recv(&pHVar9->sock,iVar4,__buf_00,(size_t)in_RCX,in_R8D);
      if ((int)sVar10 < 1) {
        std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->(local_28);
        iVar4 = Socket::getLastError();
        if (iVar4 != 0xb) {
          pDVar1 = this->m_data;
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>const*,std::vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>>
          ::__normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>*>
                    ((__normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>const*,std::vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>>
                      *)&socket,&local_18);
          local_18._M_current =
               (unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
               std::
               vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
               ::erase(&pDVar1->m_sessions,
                       (const_iterator)
                       socket._M_t.
                       super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>
                       .super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl);
          goto LAB_0019bdfb;
        }
      }
      else {
        pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                           (local_28);
        _local_90 = Socket::getBuffer(&pHVar9->sock);
        pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                           (local_28);
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(&pHVar9->request);
        sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::size
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_90);
        in_RCX = this->m_data;
        if (in_RCX->max_request_size < sVar5 + sVar11) {
          pDVar1 = this->m_data;
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>const*,std::vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>>
          ::__normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>*>
                    ((__normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>const*,std::vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>>
                      *)&local_c8,&local_18);
          local_c0 = (unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                     std::
                     vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
                     ::erase(&pDVar1->m_sessions,local_c8);
          local_18._M_current = local_c0;
          goto LAB_0019bdfb;
        }
        pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                           (local_28);
        std::__cxx11::string::operator+=
                  ((string *)&pHVar9->request,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_90);
        pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                           (local_28);
        _Var6 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                          ((string *)&pHVar9->request,&HTTP_REQUEST_ENDING,0);
        if (_Var6 == 0xffffffffffffffff) {
          pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                             (local_28);
          sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(&pHVar9->request);
          in_RCX = this->m_data;
          if (sVar5 == in_RCX->max_request_size) {
            pDVar1 = this->m_data;
            __gnu_cxx::
            __normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>const*,std::vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>>
            ::__normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>*>
                      ((__normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>const*,std::vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>>
                        *)&local_b8,&local_18);
            local_b0 = (unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                       std::
                       vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
                       ::erase(&pDVar1->m_sessions,local_b8);
            local_18._M_current = local_b0;
            goto LAB_0019bdfb;
          }
        }
        else {
          local_98 = std::chrono::_V2::steady_clock::now();
          in_RCX = (Data *)std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::
                           operator->(local_28);
          (((time_point *)&in_RCX->session_timeout)->__d).__r = local_98;
          pDVar1 = this->m_data;
          pHVar13 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator*
                              (local_28);
          Data::process_request(pDVar1,pHVar13);
          pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                             (local_28);
          if ((pHVar9->keep_alive & 1U) == 0) {
            pDVar1 = this->m_data;
            __gnu_cxx::
            __normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>const*,std::vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>>
            ::__normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>*>
                      ((__normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>const*,std::vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>>
                        *)&local_a8,&local_18);
            local_a0 = (unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                       std::
                       vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
                       ::erase(&pDVar1->m_sessions,local_a8);
            local_18._M_current = local_a0;
            goto LAB_0019bdfb;
          }
        }
      }
LAB_0019c29f:
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_*,_std::vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>_>
      ::operator++(&local_18);
      goto LAB_0019bdfb;
    }
    pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->(local_28);
    sVar10 = Socket::recv(&pHVar9->sock,iVar4,__buf,(size_t)in_RCX,in_R8D);
    if ((int)sVar10 != 0) goto LAB_0019c29f;
    pDVar1 = this->m_data;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>const*,std::vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>>
    ::__normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>*>
              ((__normal_iterator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>const*,std::vector<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>,std::allocator<std::unique_ptr<HTTPSession,std::default_delete<HTTPSession>>>>>
                *)&local_38,&local_18);
    local_30 = (unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
               std::
               vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
               ::erase(&pDVar1->m_sessions,local_38);
    local_18._M_current = local_30;
  } while( true );
  std::unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>>::
  unique_ptr<std::default_delete<Jupiter::Socket>,void>
            ((unique_ptr<Jupiter::Socket,std::default_delete<Jupiter::Socket>> *)&__range1);
  this_00 = &this->m_data->m_ports;
  __end1 = std::
           vector<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
           ::begin(this_00);
  port = (unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_> *)
         std::
         vector<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>
         ::end(this_00);
  do {
    bVar2 = __gnu_cxx::
            operator==<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_*,_std::vector<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>_>
                      (&__end1,(__normal_iterator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_*,_std::vector<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>_>
                                *)&port);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_15c = 1;
      std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>::~unique_ptr
                ((unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_> *)&__range1);
      return 0;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_*,_std::vector<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>_>
              ::operator*(&__end1);
    pSVar7 = std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>::operator->
                       (this_01);
    iVar4 = (*pSVar7->_vptr_Socket[3])();
    std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>::reset
              ((unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_> *)&__range1,
               (pointer)CONCAT44(extraout_var,iVar4));
    bVar2 = std::operator==((unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_> *)
                            &__range1,(nullptr_t)0x0);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      pSVar7 = std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>::operator->
                         ((unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_> *)
                          &__range1);
      Socket::setBlocking(pSVar7,false);
      pSVar8 = std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>::operator*
                         ((unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_> *)
                          &__range1);
      iVar4 = (int)pSVar8;
      std::make_unique<HTTPSession,Jupiter::Socket>((Socket *)&sock_buffer_1._M_str);
      pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                         ((unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                          &sock_buffer_1._M_str);
      sVar10 = Socket::recv(&pHVar9->sock,iVar4,__buf_01,(size_t)in_RCX,in_R8D);
      if ((int)sVar10 < 1) {
        std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                  ((unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                   &sock_buffer_1._M_str);
        iVar4 = Socket::getLastError();
        if (iVar4 == 0xb) {
          std::
          vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
          ::push_back(&this->m_data->m_sessions,(value_type *)&sock_buffer_1._M_str);
        }
LAB_0019c73e:
        local_15c = 0;
      }
      else {
        pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                           ((unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                            &sock_buffer_1._M_str);
        sVar14 = Socket::getBuffer(&pHVar9->sock);
        sock_buffer_1._M_len = (size_t)sVar14._M_str;
        local_128 = (undefined1  [8])sVar14._M_len;
        sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::size
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_128);
        if (sVar11 < this->m_data->max_request_size) {
          pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                             ((unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                              &sock_buffer_1._M_str);
          sVar14 = Socket::getBuffer(&pHVar9->sock);
          local_138 = sVar14;
          pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                             ((unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                              &sock_buffer_1._M_str);
          std::__cxx11::string::operator=((string *)&pHVar9->request,&local_138);
          local_148 = 4;
          local_140 = "\r\n\r\n";
          __str_00._M_str = "\r\n\r\n";
          __str_00._M_len = 4;
          in_RCX = (Data *)0x0;
          sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_128,__str_00
                              ,0);
          if (sVar12 == 0xffffffffffffffff) {
            std::
            vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
            ::push_back(&this->m_data->m_sessions,(value_type *)&sock_buffer_1._M_str);
          }
          else {
            pDVar1 = this->m_data;
            pHVar13 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator*
                                ((unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                                 &sock_buffer_1._M_str);
            Data::process_request(pDVar1,pHVar13);
            pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                               ((unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                                &sock_buffer_1._M_str);
            if ((pHVar9->keep_alive & 1U) != 0) {
              std::
              vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
              ::push_back(&this->m_data->m_sessions,(value_type *)&sock_buffer_1._M_str);
            }
          }
          goto LAB_0019c73e;
        }
        sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::size
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_128);
        in_RCX = this->m_data;
        if (sVar11 != in_RCX->max_request_size) goto LAB_0019c73e;
        local_158 = 4;
        local_150 = "\r\n\r\n";
        __str._M_str = "\r\n\r\n";
        __str._M_len = 4;
        in_RCX = (Data *)0x0;
        sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_128,__str,0);
        if (sVar12 != 0xffffffffffffffff) {
          pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                             ((unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                              &sock_buffer_1._M_str);
          sVar14 = Socket::getBuffer(&pHVar9->sock);
          local_170._M_str = sVar14._M_str;
          in_RCX = (Data *)sVar14._M_len;
          local_170._M_len = (size_t)in_RCX;
          pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                             ((unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                              &sock_buffer_1._M_str);
          std::__cxx11::string::operator=((string *)&pHVar9->request,&local_170);
          pDVar1 = this->m_data;
          pHVar13 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator*
                              ((unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                               &sock_buffer_1._M_str);
          Data::process_request(pDVar1,pHVar13);
          pHVar9 = std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::operator->
                             ((unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)
                              &sock_buffer_1._M_str);
          if ((pHVar9->keep_alive & 1U) != 0) {
            std::
            vector<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>,_std::allocator<std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>_>_>
            ::push_back(&this->m_data->m_sessions,(value_type *)&sock_buffer_1._M_str);
          }
          goto LAB_0019c73e;
        }
        local_15c = 5;
      }
      std::unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_>::~unique_ptr
                ((unique_ptr<HTTPSession,_std::default_delete<HTTPSession>_> *)&sock_buffer_1._M_str
                );
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_*,_std::vector<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>,_std::allocator<std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

int Jupiter::HTTP::Server::think() {
	// Process existing clients
	for (auto itr = m_data->m_sessions.begin(); itr != m_data->m_sessions.end();) {
		auto& session = *itr;
		if (session->sock.isShutdown()) {
			if (session->sock.recv() == 0) {
				itr = m_data->m_sessions.erase(itr);
				continue;
			}
		}
		else if ((std::chrono::steady_clock::now() > session->last_active + m_data->keep_alive_session_timeout)
			|| (session->keep_alive == false && std::chrono::steady_clock::now() > session->last_active + m_data->session_timeout)) {
			itr = m_data->m_sessions.erase(itr);
			continue;
		}
		else if (session->sock.recv() > 0) {
			std::string_view sock_buffer = session->sock.getBuffer();
			if (session->request.size() + sock_buffer.size() <= m_data->max_request_size) { // accept
				session->request += sock_buffer;
				if (session->request.find(HTTP_REQUEST_ENDING) != std::string::npos) { // completed request
					session->last_active = std::chrono::steady_clock::now();
					m_data->process_request(*session);
					if (session->keep_alive == false) { // remove completed session
						itr = m_data->m_sessions.erase(itr);
						//session->sock.shutdown();
						continue;
					}
					// else // keep_alive: session not deleted
				}
				else if (session->request.size() == m_data->max_request_size) { // reject (full buffer)
					itr = m_data->m_sessions.erase(itr);
					continue;
				}
				// else // request not over: session not deleted
			}
			else { // reject
				itr = m_data->m_sessions.erase(itr);
				continue;
			}
		}
		else if (session->sock.getLastError() != JUPITER_SOCK_EWOULDBLOCK) {
			itr = m_data->m_sessions.erase(itr);
			continue;
		}
		// else // EWOULDBLOCK: session not deleted

		++itr;
	}

	// Process incoming clients
	std::unique_ptr<Jupiter::Socket> socket;
	for (auto& port : m_data->m_ports) {
		socket.reset(port->accept());
		if (socket != nullptr) {
			socket->setBlocking(false);
			auto session = std::make_unique<HTTPSession>(std::move(*socket));
			if (session->sock.recv() > 0) { // data received
				std::string_view sock_buffer = session->sock.getBuffer();
				if (sock_buffer.size() < m_data->max_request_size) { // accept
					session->request = session->sock.getBuffer();
					if (sock_buffer.find(HTTP_REQUEST_ENDING) != std::string_view::npos) { // completed request
						m_data->process_request(*session);
						if (session->keep_alive) { // session will live for 30 seconds.
							m_data->m_sessions.push_back(std::move(session));
						}
						// else // session completed
					}
					else { // store for more processing
						m_data->m_sessions.push_back(std::move(session));
					}
				}
				else if (sock_buffer.size() == m_data->max_request_size) {
					if (sock_buffer.find(HTTP_REQUEST_ENDING) == std::string_view::npos) { // reject (too large)
						continue;
					}

					// accept (max size, completed request)
					session->request = session->sock.getBuffer();
					m_data->process_request(*session);
					if (session->keep_alive) { // session will live for 30 seconds.
						m_data->m_sessions.push_back(std::move(session));
					}
					// else // session completed
				}
				// else // reject (too large)
			}
			else if (session->sock.getLastError() == JUPITER_SOCK_EWOULDBLOCK) { // store for more processing
				m_data->m_sessions.push_back(std::move(session));
			}
		}
	}
	return 0;
}